

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.h
# Opt level: O3

void __thiscall BamTools::SamSequence::~SamSequence(SamSequence *this)

{
  pointer pcVar1;
  
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::~vector
            (&this->CustomTags);
  pcVar1 = (this->URI)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->URI).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->Species)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Species).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->Name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->Length)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Length).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->Checksum)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Checksum).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->AssemblyID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->AssemblyID).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

struct API_EXPORT SamSequence
{

    // ctor & dtor
    SamSequence();
    SamSequence(const std::string& name, const int& length);
    SamSequence(const std::string& name, const std::string& length);

    // query/modify entire sequence
    void Clear();  // clears all contents

    // convenience query methods
    bool HasAssemblyID() const;  // returns true if sequence has an assembly ID
    bool HasChecksum() const;    // returns true if sequence has an MD5 checksum
    bool HasLength() const;      // returns true if sequence has a length
    bool HasName() const;        // returns true if sequence has a name
    bool HasSpecies() const;     // returns true if sequence has a species ID
    bool HasURI() const;         // returns true if sequence has a URI

    // data members
    std::string AssemblyID;                   // AS:<AssemblyID>
    std::string Checksum;                     // M5:<Checksum>
    std::string Length;                       // LN:<Length>      *Required for valid SAM header*
    std::string Name;                         // SN:<Name>        *Required for valid SAM header*
    std::string Species;                      // SP:<Species>
    std::string URI;                          // UR:<URI>
    std::vector<CustomHeaderTag> CustomTags;  // optional custom tags
}